

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddReorder.c
# Opt level: O1

int ddSiftingBackward(DdManager *table,int size,Move *moves)

{
  Move **ppMVar1;
  int iVar2;
  Move *pMVar3;
  
  pMVar3 = moves;
  if (moves != (Move *)0x0) {
    do {
      if (pMVar3->size < size) {
        size = pMVar3->size;
      }
      ppMVar1 = &pMVar3->next;
      pMVar3 = *ppMVar1;
    } while (*ppMVar1 != (Move *)0x0);
  }
  while( true ) {
    if (moves == (Move *)0x0) {
      return 1;
    }
    if (moves->size == size) break;
    iVar2 = cuddSwapInPlace(table,moves->x,moves->y);
    if (iVar2 == 0) {
      return 0;
    }
    moves = moves->next;
  }
  return 1;
}

Assistant:

static int
ddSiftingBackward(
  DdManager * table,
  int  size,
  Move * moves)
{
    Move *move;
    int res;

    for (move = moves; move != NULL; move = move->next) {
        if (move->size < size) {
            size = move->size;
        }
    }

    for (move = moves; move != NULL; move = move->next) {
        if (move->size == size) return(1);
        res = cuddSwapInPlace(table,(int)move->x,(int)move->y);
        if (!res) return(0);
    }

    return(1);

}